

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ngx_string.c
# Opt level: O0

ngx_int_t ngx_rstrncmp(u_char *s1,u_char *s2,size_t n)

{
  long local_28;
  size_t n_local;
  u_char *s2_local;
  u_char *s1_local;
  
  if (n == 0) {
    s1_local = (u_char *)0x0;
  }
  else {
    for (local_28 = n - 1; s1[local_28] == s2[local_28]; local_28 = local_28 + -1) {
      if (local_28 == 0) {
        return 0;
      }
    }
    s1_local = (u_char *)(long)(int)((uint)s1[local_28] - (uint)s2[local_28]);
  }
  return (ngx_int_t)s1_local;
}

Assistant:

ngx_int_t
ngx_rstrncmp(u_char *s1, u_char *s2, size_t n)
{
    if (n == 0) {
        return 0;
    }

    n--;

    for ( ;; ) {
        if (s1[n] != s2[n]) {
            return s1[n] - s2[n];
        }

        if (n == 0) {
            return 0;
        }

        n--;
    }
}